

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O2

uint aom_highbd_sad16x16_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = aom_highbd_sad16x8_avg_avx2(src,src_stride,ref,ref_stride,second_pred);
  uVar2 = aom_highbd_sad16x8_avg_avx2
                    (src + src_stride * 8,src_stride,ref + ref_stride * 8,ref_stride,
                     second_pred + 0x80);
  return uVar2 + uVar1;
}

Assistant:

unsigned int aom_highbd_sad16x16_avg_avx2(const uint8_t *src, int src_stride,
                                          const uint8_t *ref, int ref_stride,
                                          const uint8_t *second_pred) {
  const int left_shift = 3;
  uint32_t sum = aom_highbd_sad16x8_avg_avx2(src, src_stride, ref, ref_stride,
                                             second_pred);
  src += src_stride << left_shift;
  ref += ref_stride << left_shift;
  second_pred += 16 << left_shift;
  sum += aom_highbd_sad16x8_avg_avx2(src, src_stride, ref, ref_stride,
                                     second_pred);
  return sum;
}